

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O3

ServerSegment * __thiscall ServerService::startControlService(ServerService *this)

{
  byte *__s;
  uint __fd;
  ServerSegment *pSVar1;
  size_t sVar2;
  ServerService *this_00;
  socklen_t clientLength;
  sockaddr_storage clientDetails;
  byte buffer [1472];
  socklen_t local_65c;
  sockaddr local_658 [8];
  byte local_5d8 [1472];
  
  memset(local_5d8,0,0x5c0);
  local_65c = 0x80;
  __fd = ServerSocketUDP::getSocket(this->serverSocketUDP);
  this_00 = (ServerService *)(ulong)__fd;
  recvfrom(__fd,local_5d8,0x5c0,0,local_658,&local_65c);
  pSVar1 = parseRequest(this_00,local_5d8);
  if ((pSVar1->data == (byte *)0x0) || (pSVar1->ackFlag != 'N')) {
    pSVar1 = (ServerSegment *)0x0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"received: ",10);
    __s = pSVar1->data;
    if (__s == (byte *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109160);
    }
    else {
      sVar2 = strlen((char *)__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
  }
  return pSVar1;
}

Assistant:

ServerSegment* ServerService::startControlService() {
    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    clientLength = sizeof(clientDetails);
    recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
    ServerSegment *segment = parseRequest(buffer);

    if (segment->data && segment->ackFlag == 'N') {
        cout << "received: ";
        cout << (char *) segment->data << endl;
        return segment;
    } else {
        return nullptr;
    }
}